

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

ssize_t __thiscall
phosg::StringReader::read(StringReader *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  
  uVar1 = this->length;
  uVar2 = this->offset;
  if (uVar1 < uVar2 || uVar1 - uVar2 == 0) {
    __buf = (void *)0x0;
  }
  else if (uVar1 < uVar2 + (long)__buf) {
    memcpy((void *)CONCAT44(in_register_00000034,__fd),this->data + uVar2,uVar1 - uVar2);
    __buf = (void *)(this->length - uVar2);
  }
  else {
    memcpy((void *)CONCAT44(in_register_00000034,__fd),this->data + uVar2,(size_t)__buf);
  }
  if ((char)__nbytes == '\x01' && __buf != (void *)0x0) {
    this->offset = this->offset + (long)__buf;
  }
  return (ssize_t)__buf;
}

Assistant:

size_t StringReader::read(void* data, size_t size, bool advance) {
  size_t ret = this->pread(this->offset, data, size);
  if (ret && advance) {
    this->offset += ret;
  }
  return ret;
}